

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbocompression.h
# Opt level: O0

uint8_t * turbouncompress(uint8_t *in,uint32_t *out,uint32_t *nvalue)

{
  uint uVar1;
  uint *in_RDX;
  long in_RSI;
  uint *in_RDI;
  uint32_t leftover;
  uint32_t *output;
  uint8_t *input;
  uint32_t k;
  int b;
  uint32_t M;
  uint32_t m;
  uint32_t *local_40;
  uint8_t *local_38;
  uint local_30;
  uint32_t local_2c;
  uint local_28;
  uint local_24;
  uint *local_20;
  void *local_18;
  uint *local_10;
  uint *local_8;
  
  *in_RDX = *in_RDI;
  local_8 = in_RDI + 1;
  if (*in_RDX != 0) {
    local_24 = *local_8;
    local_28 = in_RDI[2];
    local_10 = in_RDI + 3;
    local_20 = in_RDX;
    local_18 = (void *)in_RSI;
    local_2c = bits(local_28 - local_24);
    for (local_30 = 0; local_30 < *local_20 >> 5; local_30 = local_30 + 1) {
      local_38 = (uint8_t *)((long)local_10 + (ulong)(local_2c * 0x20 * local_30 >> 3));
      local_40 = (uint32_t *)((long)local_18 + (ulong)(local_30 << 5) * 4);
      (*funcForUnpackArr[(int)local_2c])(local_24,&local_38,&local_40);
    }
    local_10 = (uint *)((long)local_10 + (ulong)(((int)(local_2c << 5) / 8) * (*local_20 >> 5)));
    local_18 = (void *)((long)local_18 + (ulong)(*local_20 & 0xffffffe0) * 4);
    uVar1 = *local_20 - (*local_20 & 0xffffffe0);
    memcpy(local_18,local_10,(ulong)uVar1 << 2);
    local_8 = (uint *)((ulong)uVar1 * 4 + (long)local_10);
  }
  return (uint8_t *)local_8;
}

Assistant:

inline const uint8_t *turbouncompress(const uint8_t *in, uint32_t *out,
                                      uint32_t &nvalue) {
  memcpy(&nvalue, in, sizeof(nvalue));
  in += sizeof(nvalue);
  if (nvalue == 0)
    return in;
  uint32_t m, M;
  memcpy(&m, in, sizeof(m));
  in += sizeof(m);
  memcpy(&M, in, sizeof(M));
  in += sizeof(M);
  int b = bits(static_cast<uint32_t>(M - m));
#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (uint32_t k = 0; k < nvalue / 32; ++k) {
    // could code as funcForUnpackArr[b](m,&in,&out); but it hurts
    // parallelization
    const uint8_t *input = in + 32 * b * k / 8;
    uint32_t *output = out + k * 32;
    funcForUnpackArr[b](m, &input, &output);
  }
  in = in + (32 * b / 8) * (nvalue / 32);
  out = out + 32 * (nvalue / 32);

  // we could pack the rest, but we don't  bother
  uint32_t leftover = nvalue - nvalue / 32 * 32;
  memcpy(out, in, leftover * sizeof(uint32_t));
  in += leftover * sizeof(uint32_t);
  return in;
}